

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O3

void __thiscall Assimp::PretransformVertices::Execute(PretransformVertices *this,aiScene *pScene)

{
  char *pcVar1;
  size_t *psVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ulong uVar8;
  aiMesh *paVar9;
  aiBone *paVar10;
  _List_node_base *p_Var11;
  aiAnimation *this_00;
  aiCamera *paVar12;
  aiLight *paVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  pointer __src;
  bool bVar20;
  Logger *pLVar21;
  aiMesh **__dest;
  uint auVar22 [2];
  ulong *puVar23;
  aiVector3D *paVar24;
  aiColor4D *__s;
  aiNode *paVar25;
  aiNode *paVar26;
  uint *puVar27;
  aiNode **ppaVar28;
  runtime_error *this_01;
  byte bVar29;
  aiFace *paVar30;
  int iVar31;
  uint uVar32;
  long lVar33;
  _List_node_base *p_Var34;
  uint uVar35;
  PretransformVertices *pPVar36;
  PretransformVertices *pPVar37;
  ulong uVar38;
  ulong uVar39;
  uint uVar40;
  ulong uVar41;
  size_t sVar42;
  uint uVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined8 uVar47;
  float fVar49;
  undefined1 auVar48 [16];
  float fVar50;
  undefined8 uVar51;
  float fVar53;
  undefined1 auVar52 [16];
  uint local_220;
  uint iVertices;
  list<unsigned_int,_std::allocator<unsigned_int>_> aiVFormats;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> apcOutMeshes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> s;
  uint aiTemp [2];
  undefined1 local_198 [96];
  ios_base local_138 [264];
  
  pLVar21 = DefaultLogger::get();
  Logger::debug(pLVar21,"PretransformVerticesProcess begin");
  if (pScene->mNumMeshes == 0) {
    return;
  }
  paVar25 = pScene->mRootNode;
  CountNodes(this,paVar25);
  if (this->configTransform == true) {
    fVar16 = (this->configTransformation).a1;
    fVar17 = (this->configTransformation).a2;
    fVar18 = (this->configTransformation).a3;
    fVar19 = (this->configTransformation).a4;
    fVar4 = (this->configTransformation).b1;
    fVar5 = (this->configTransformation).b2;
    fVar6 = (this->configTransformation).b3;
    fVar7 = (this->configTransformation).b4;
    fVar45 = (this->configTransformation).c1;
    fVar49 = (this->configTransformation).c2;
    fVar53 = (this->configTransformation).c3;
    fVar3 = (this->configTransformation).c4;
    fVar44 = (this->configTransformation).d2;
    fVar50 = (this->configTransformation).d3;
    fVar46 = (this->configTransformation).d4;
    (paVar25->mTransformation).d1 = (this->configTransformation).d1;
    (paVar25->mTransformation).d2 = fVar44;
    (paVar25->mTransformation).d3 = fVar50;
    (paVar25->mTransformation).d4 = fVar46;
    (paVar25->mTransformation).c1 = fVar45;
    (paVar25->mTransformation).c2 = fVar49;
    (paVar25->mTransformation).c3 = fVar53;
    (paVar25->mTransformation).c4 = fVar3;
    (paVar25->mTransformation).b1 = fVar4;
    (paVar25->mTransformation).b2 = fVar5;
    (paVar25->mTransformation).b3 = fVar6;
    (paVar25->mTransformation).b4 = fVar7;
    (paVar25->mTransformation).a1 = fVar16;
    (paVar25->mTransformation).a2 = fVar17;
    (paVar25->mTransformation).a3 = fVar18;
    (paVar25->mTransformation).a4 = fVar19;
    paVar25 = pScene->mRootNode;
  }
  ComputeAbsoluteTransform(this,paVar25);
  if (pScene->mNumMeshes == 0) {
    uVar40 = 0;
  }
  else {
    uVar41 = 0;
    do {
      paVar9 = pScene->mMeshes[uVar41];
      if (paVar9->mNumBones != 0) {
        uVar39 = 0;
        do {
          paVar10 = paVar9->mBones[uVar39];
          if ((paVar10 != (aiBone *)0x0) && (paVar10->mWeights != (aiVertexWeight *)0x0)) {
            operator_delete__(paVar10->mWeights);
          }
          operator_delete(paVar10,0x460);
          uVar39 = uVar39 + 1;
        } while (uVar39 < paVar9->mNumBones);
      }
      if (paVar9->mBones != (aiBone **)0x0) {
        operator_delete__(paVar9->mBones);
      }
      paVar9->mBones = (aiBone **)0x0;
      uVar41 = uVar41 + 1;
      uVar40 = pScene->mNumMeshes;
    } while (uVar41 < uVar40);
  }
  apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->configKeepHierarchy == false) {
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
              (&apcOutMeshes,(ulong)(pScene->mNumMaterials * 2));
    aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)&aiVFormats;
    aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node._M_size
         = 0;
    aiTemp = (uint  [2])((ulong)aiTemp & 0xffffffff00000000);
    aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
    super__List_node_base._M_prev =
         aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
         super__List_node_base._M_next;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&s,(ulong)pScene->mNumMeshes,aiTemp,(allocator_type *)&iVertices);
    BuildMeshRefCountArray
              (this,pScene->mRootNode,
               s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (pScene->mNumMaterials != 0) {
      uVar40 = 0;
      do {
        pPVar36 = (PretransformVertices *)
                  aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  _M_node.super__List_node_base._M_next;
        while (pPVar36 != (PretransformVertices *)&aiVFormats) {
          pPVar37 = (PretransformVertices *)(pPVar36->super_BaseProcess)._vptr_BaseProcess;
          operator_delete(pPVar36,0x18);
          pPVar36 = pPVar37;
        }
        aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
        _M_size = 0;
        aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
        super__List_node_base._M_next = (_List_node_base *)&aiVFormats;
        aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
        super__List_node_base._M_prev = (_List_node_base *)&aiVFormats;
        GetVFormatList(pPVar36,pScene,uVar40,&aiVFormats);
        std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::sort(&aiVFormats);
        std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::unique(&aiVFormats);
        p_Var34 = aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  _M_node.super__List_node_base._M_next;
        if ((PretransformVertices *)
            aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node
            .super__List_node_base._M_next != (PretransformVertices *)&aiVFormats) {
          do {
            iVertices = 0;
            local_220 = 0;
            CountVerticesAndFaces
                      (this,pScene,pScene->mRootNode,uVar40,*(uint *)&p_Var34[1]._M_next,&local_220,
                       &iVertices);
            uVar35 = iVertices;
            uVar32 = local_220;
            uVar41 = (ulong)local_220;
            if (iVertices != 0 && uVar41 != 0) {
              auVar22 = (uint  [2])operator_new(0x520);
              *(undefined8 *)auVar22 = 0;
              *(undefined4 *)((long)auVar22 + 8) = 0;
              memset((undefined8 *)((long)auVar22 + 0x10),0,0xcc);
              *(undefined8 *)((long)auVar22 + 0xe0) = 0;
              *(undefined8 *)((long)auVar22 + 0xe8) = 0;
              *(undefined1 *)((long)auVar22 + 0xf0) = 0;
              memset((void *)((long)auVar22 + 0xf1),0x1b,0x3ff);
              *(undefined4 *)((long)auVar22 + 0x4f0) = 0;
              *(undefined8 *)((long)auVar22 + 0x4f8) = 0;
              *(undefined8 *)((long)auVar22 + 0x500) = 0;
              *(undefined8 *)((long)auVar22 + 0x508) = 0;
              *(undefined8 *)((long)auVar22 + 0x510) = 0;
              *(undefined4 *)((long)auVar22 + 0x518) = 0;
              memset((undefined8 *)((long)auVar22 + 0x30),0,0xa0);
              aiTemp = auVar22;
              std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
                        ((vector<aiMesh*,std::allocator<aiMesh*>> *)&apcOutMeshes,(aiMesh **)aiTemp)
              ;
              paVar9 = apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       super__Vector_impl_data._M_finish[-1];
              paVar9->mNumFaces = uVar32;
              paVar9->mNumVertices = uVar35;
              puVar23 = (ulong *)operator_new__(uVar41 * 0x10 + 8);
              *puVar23 = uVar41;
              paVar30 = (aiFace *)(puVar23 + 1);
              do {
                paVar30->mNumIndices = 0;
                paVar30->mIndices = (uint *)0x0;
                paVar30 = paVar30 + 1;
              } while (paVar30 != (aiFace *)(puVar23 + uVar41 * 2 + 1));
              paVar9->mFaces = (aiFace *)(puVar23 + 1);
              uVar41 = (ulong)uVar35 * 0xc;
              paVar24 = (aiVector3D *)operator_new__(uVar41);
              sVar42 = ((uVar41 - 0xc) / 0xc) * 0xc + 0xc;
              memset(paVar24,0,sVar42);
              paVar9->mVertices = paVar24;
              paVar9->mMaterialIndex = uVar40;
              uVar32 = *(uint *)&p_Var34[1]._M_next;
              if ((uVar32 & 2) != 0) {
                paVar24 = (aiVector3D *)operator_new__(uVar41);
                memset(paVar24,0,sVar42);
                paVar9->mNormals = paVar24;
                uVar32 = *(uint *)&p_Var34[1]._M_next;
              }
              if ((uVar32 & 4) != 0) {
                paVar24 = (aiVector3D *)operator_new__(uVar41);
                memset(paVar24,0,sVar42);
                paVar9->mTangents = paVar24;
                paVar24 = (aiVector3D *)operator_new__(uVar41);
                memset(paVar24,0,sVar42);
                paVar9->mBitangents = paVar24;
                uVar32 = *(uint *)&p_Var34[1]._M_next;
              }
              if ((uVar32 >> 8 & 1) != 0) {
                uVar39 = 0;
                do {
                  paVar24 = (aiVector3D *)operator_new__(uVar41);
                  memset(paVar24,0,sVar42);
                  paVar9->mTextureCoords[uVar39] = paVar24;
                  paVar9->mNumUVComponents[uVar39] =
                       (((*(uint *)&p_Var34[1]._M_next >> ((byte)uVar39 & 0x1f)) >> 0x10 & 1) != 0)
                       + 2;
                  uVar43 = (int)uVar39 + 1;
                  uVar39 = (ulong)uVar43;
                  uVar32 = *(uint *)&p_Var34[1]._M_next;
                } while (((uVar32 >> ((byte)uVar43 & 0x1f)) >> 8 & 1) != 0);
              }
              if ((uVar32 >> 0x18 & 1) != 0) {
                uVar41 = (ulong)uVar35 << 4;
                iVar31 = 1;
                do {
                  __s = (aiColor4D *)operator_new__(uVar41);
                  memset(__s,0,uVar41);
                  paVar9->mColors[iVar31 - 1] = __s;
                  uVar32 = *(uint *)&p_Var34[1]._M_next;
                  bVar29 = (byte)iVar31;
                  iVar31 = iVar31 + 1;
                } while (((uVar32 >> (bVar29 & 0x1f)) >> 0x18 & 1) != 0);
              }
              aiTemp[0] = 0;
              aiTemp[1] = 0;
              CollectData(this,pScene,pScene->mRootNode,uVar40,uVar32,paVar9,aiTemp,
                          s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
            }
            p_Var34 = (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var34->_M_next
                       )->_M_impl)._M_node.super__List_node_base._M_next;
          } while (p_Var34 != (_List_node_base *)&aiVFormats);
        }
        uVar40 = uVar40 + 1;
      } while (uVar40 < pScene->mNumMaterials);
    }
    if (apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      aiTemp = (uint  [2])local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)aiTemp,
                 "No output meshes: all meshes are orphaned and are not referenced by any nodes","")
      ;
      std::runtime_error::runtime_error(this_01,(string *)aiTemp);
      *(undefined ***)this_01 = &PTR__runtime_error_0080bf48;
      __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (pScene->mNumMeshes != 0) {
      uVar41 = 0;
      do {
        paVar9 = pScene->mMeshes[uVar41];
        paVar9->mNumBones = 0;
        paVar9->mBones = (aiBone **)0x0;
        if (paVar9->mNumFaces != 0) {
          lVar33 = 0;
          uVar39 = 0;
          do {
            *(undefined4 *)((long)&paVar9->mFaces->mNumIndices + lVar33) = 0;
            *(undefined8 *)((long)&paVar9->mFaces->mIndices + lVar33) = 0;
            uVar39 = uVar39 + 1;
            lVar33 = lVar33 + 0x10;
          } while (uVar39 < paVar9->mNumFaces);
        }
        aiMesh::~aiMesh(paVar9);
        operator_delete(paVar9,0x520);
        uVar41 = uVar41 + 1;
      } while (uVar41 < pScene->mNumMeshes);
    }
    uVar40 = (uint)((ulong)((long)apcOutMeshes.
                                  super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)apcOutMeshes.
                                 super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 3);
    pScene->mNumMeshes = uVar40;
    if (uVar40 != 0) {
      uVar41 = 0;
      do {
        pScene->mMeshes[uVar41] =
             apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar41];
        uVar41 = uVar41 + 1;
      } while (uVar41 < pScene->mNumMeshes);
    }
    if (s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    p_Var34 = aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              _M_node.super__List_node_base._M_next;
    while (p_Var34 != (_List_node_base *)&aiVFormats) {
      p_Var11 = (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var34->_M_next)->
                _M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var34,0x18);
      p_Var34 = p_Var11;
    }
  }
  else {
    pPVar36 = this;
    BuildWCSMeshes(this,&apcOutMeshes,pScene->mMeshes,uVar40,pScene->mRootNode);
    __src = apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start;
    uVar40 = pScene->mNumMeshes;
    uVar41 = (ulong)uVar40;
    sVar42 = (long)apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (sVar42 != 0) {
      lVar33 = (long)apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      uVar39 = lVar33 + uVar41;
      __dest = (aiMesh **)operator_new__(-(ulong)(uVar39 >> 0x3d != 0) | uVar39 * 8);
      pPVar37 = (PretransformVertices *)pScene->mMeshes;
      memcpy(__dest,pPVar37,uVar41 * 8);
      pPVar36 = (PretransformVertices *)(__dest + uVar41);
      memcpy(pPVar36,__src,sVar42);
      uVar40 = uVar40 + (int)lVar33;
      pScene->mNumMeshes = uVar40;
      if (pPVar37 != (PretransformVertices *)0x0) {
        operator_delete__(pPVar37);
        uVar40 = pScene->mNumMeshes;
        pPVar36 = pPVar37;
      }
      pScene->mMeshes = __dest;
    }
    if (uVar40 != 0) {
      uVar41 = 0;
      do {
        ApplyTransform(pPVar36,pScene->mMeshes[uVar41],
                       (aiMatrix4x4 *)pScene->mMeshes[uVar41]->mBones);
        pScene->mMeshes[uVar41]->mBones = (aiBone **)0x0;
        pScene->mMeshes[uVar41]->mNumBones = 0;
        uVar41 = uVar41 + 1;
      } while (uVar41 < pScene->mNumMeshes);
    }
  }
  if (pScene->mNumAnimations != 0) {
    uVar41 = 0;
    do {
      this_00 = pScene->mAnimations[uVar41];
      if (this_00 != (aiAnimation *)0x0) {
        aiAnimation::~aiAnimation(this_00);
      }
      operator_delete(this_00,0x448);
      uVar41 = uVar41 + 1;
    } while (uVar41 < pScene->mNumAnimations);
  }
  if (pScene->mAnimations != (aiAnimation **)0x0) {
    operator_delete__(pScene->mAnimations);
  }
  pScene->mAnimations = (aiAnimation **)0x0;
  pScene->mNumAnimations = 0;
  if (pScene->mNumCameras != 0) {
    uVar41 = 0;
    do {
      paVar12 = pScene->mCameras[uVar41];
      paVar25 = aiNode::FindNode(pScene->mRootNode,(paVar12->mName).data);
      if (paVar25 == (aiNode *)0x0) {
        __assert_fail("__null != nd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/PretransformVertices.cpp"
                      ,0x245,"virtual void Assimp::PretransformVertices::Execute(aiScene *)");
      }
      fVar44 = (paVar12->mPosition).x;
      fVar50 = (paVar12->mPosition).y;
      fVar46 = (paVar12->mPosition).z;
      fVar45 = (paVar25->mTransformation).b2;
      fVar49 = (paVar25->mTransformation).b1;
      fVar53 = (paVar25->mTransformation).b3;
      fVar3 = (paVar25->mTransformation).b4;
      fVar4 = (paVar25->mTransformation).c2;
      fVar5 = (paVar25->mTransformation).c1;
      fVar6 = (paVar25->mTransformation).c3;
      fVar7 = (paVar25->mTransformation).c4;
      (paVar12->mPosition).x =
           (paVar25->mTransformation).a4 +
           fVar46 * (paVar25->mTransformation).a3 +
           fVar44 * (paVar25->mTransformation).a1 + (paVar25->mTransformation).a2 * fVar50;
      (paVar12->mPosition).y = fVar3 + fVar46 * fVar53 + fVar44 * fVar49 + fVar45 * fVar50;
      (paVar12->mPosition).z = fVar46 * fVar6 + fVar44 * fVar5 + fVar50 * fVar4 + fVar7;
      fVar44 = (paVar12->mLookAt).x;
      fVar50 = (paVar12->mLookAt).y;
      fVar46 = (paVar12->mLookAt).z;
      fVar45 = (paVar25->mTransformation).b2;
      fVar49 = (paVar25->mTransformation).b1;
      fVar53 = (paVar25->mTransformation).b3;
      fVar3 = (paVar25->mTransformation).c2;
      fVar4 = (paVar25->mTransformation).c1;
      fVar5 = (paVar25->mTransformation).c3;
      (paVar12->mLookAt).x =
           fVar46 * (paVar25->mTransformation).a3 +
           fVar44 * (paVar25->mTransformation).a1 + fVar50 * (paVar25->mTransformation).a2;
      (paVar12->mLookAt).y = fVar46 * fVar53 + fVar44 * fVar49 + fVar50 * fVar45;
      (paVar12->mLookAt).z = fVar46 * fVar5 + fVar44 * fVar4 + fVar50 * fVar3;
      fVar44 = (paVar12->mUp).x;
      fVar50 = (paVar12->mUp).y;
      fVar46 = (paVar12->mUp).z;
      fVar45 = (paVar25->mTransformation).b2;
      fVar49 = (paVar25->mTransformation).b1;
      fVar53 = (paVar25->mTransformation).b3;
      fVar3 = (paVar25->mTransformation).c2;
      fVar4 = (paVar25->mTransformation).c1;
      fVar5 = (paVar25->mTransformation).c3;
      (paVar12->mUp).x =
           fVar46 * (paVar25->mTransformation).a3 +
           fVar44 * (paVar25->mTransformation).a1 + fVar50 * (paVar25->mTransformation).a2;
      (paVar12->mUp).y = fVar46 * fVar53 + fVar44 * fVar49 + fVar50 * fVar45;
      (paVar12->mUp).z = fVar46 * fVar5 + fVar44 * fVar4 + fVar50 * fVar3;
      uVar41 = uVar41 + 1;
    } while (uVar41 < pScene->mNumCameras);
  }
  if (pScene->mNumLights != 0) {
    uVar41 = 0;
    do {
      paVar13 = pScene->mLights[uVar41];
      paVar25 = aiNode::FindNode(pScene->mRootNode,(paVar13->mName).data);
      if (paVar25 == (aiNode *)0x0) {
        __assert_fail("__null != nd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/PretransformVertices.cpp"
                      ,0x251,"virtual void Assimp::PretransformVertices::Execute(aiScene *)");
      }
      fVar44 = (paVar13->mPosition).x;
      fVar50 = (paVar13->mPosition).y;
      fVar46 = (paVar13->mPosition).z;
      fVar45 = (paVar25->mTransformation).b2;
      fVar49 = (paVar25->mTransformation).b1;
      fVar53 = (paVar25->mTransformation).b3;
      fVar3 = (paVar25->mTransformation).b4;
      fVar4 = (paVar25->mTransformation).c2;
      fVar5 = (paVar25->mTransformation).c1;
      fVar6 = (paVar25->mTransformation).c3;
      fVar7 = (paVar25->mTransformation).c4;
      (paVar13->mPosition).x =
           (paVar25->mTransformation).a4 +
           fVar46 * (paVar25->mTransformation).a3 +
           fVar44 * (paVar25->mTransformation).a1 + (paVar25->mTransformation).a2 * fVar50;
      (paVar13->mPosition).y = fVar3 + fVar46 * fVar53 + fVar44 * fVar49 + fVar45 * fVar50;
      (paVar13->mPosition).z = fVar46 * fVar6 + fVar44 * fVar5 + fVar50 * fVar4 + fVar7;
      fVar44 = (paVar13->mDirection).x;
      fVar50 = (paVar13->mDirection).y;
      fVar46 = (paVar13->mDirection).z;
      fVar45 = (paVar25->mTransformation).b2;
      fVar49 = (paVar25->mTransformation).b1;
      fVar53 = (paVar25->mTransformation).b3;
      fVar3 = (paVar25->mTransformation).c2;
      fVar4 = (paVar25->mTransformation).c1;
      fVar5 = (paVar25->mTransformation).c3;
      (paVar13->mDirection).x =
           fVar46 * (paVar25->mTransformation).a3 +
           fVar44 * (paVar25->mTransformation).a1 + fVar50 * (paVar25->mTransformation).a2;
      (paVar13->mDirection).y = fVar46 * fVar53 + fVar44 * fVar49 + fVar50 * fVar45;
      (paVar13->mDirection).z = fVar46 * fVar5 + fVar44 * fVar4 + fVar50 * fVar3;
      fVar44 = (paVar13->mUp).x;
      fVar50 = (paVar13->mUp).y;
      fVar46 = (paVar13->mUp).z;
      fVar45 = (paVar25->mTransformation).b2;
      fVar49 = (paVar25->mTransformation).b1;
      fVar53 = (paVar25->mTransformation).b3;
      fVar3 = (paVar25->mTransformation).c2;
      fVar4 = (paVar25->mTransformation).c1;
      fVar5 = (paVar25->mTransformation).c3;
      (paVar13->mUp).x =
           fVar46 * (paVar25->mTransformation).a3 +
           fVar44 * (paVar25->mTransformation).a1 + fVar50 * (paVar25->mTransformation).a2;
      (paVar13->mUp).y = fVar46 * fVar53 + fVar44 * fVar49 + fVar50 * fVar45;
      (paVar13->mUp).z = fVar46 * fVar5 + fVar44 * fVar4 + fVar50 * fVar3;
      uVar41 = uVar41 + 1;
    } while (uVar41 < pScene->mNumLights);
  }
  if (this->configKeepHierarchy == false) {
    paVar26 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar26);
    paVar25 = pScene->mRootNode;
    if (paVar26 != paVar25) {
      uVar40 = (paVar25->mName).length;
      (paVar26->mName).length = uVar40;
      memcpy((paVar26->mName).data,(paVar25->mName).data,(ulong)uVar40);
      (paVar26->mName).data[uVar40] = '\0';
    }
    aiNode::~aiNode(paVar25);
    operator_delete(paVar25,0x478);
    pScene->mRootNode = paVar26;
    uVar40 = pScene->mNumMeshes;
    uVar32 = pScene->mNumLights;
    if (uVar40 == 1) {
      uVar35 = pScene->mNumCameras;
      if (uVar35 == 0 && uVar32 == 0) {
        paVar26->mNumMeshes = 1;
        puVar27 = (uint *)operator_new__(4);
        paVar26->mMeshes = puVar27;
        *puVar27 = 0;
        goto LAB_002f96e7;
      }
    }
    else {
      uVar35 = pScene->mNumCameras;
    }
    uVar35 = uVar35 + uVar32 + uVar40;
    paVar26->mNumChildren = uVar35;
    ppaVar28 = (aiNode **)operator_new__((ulong)uVar35 << 3);
    paVar26->mChildren = ppaVar28;
    if (uVar40 != 0) {
      lVar33 = 0;
      uVar41 = 0;
      do {
        paVar25 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar25);
        ppaVar28[uVar41] = paVar25;
        paVar25->mParent = pScene->mRootNode;
        paVar9 = pScene->mMeshes[uVar41];
        if (paVar25 != (aiNode *)&paVar9->mName) {
          uVar40 = (paVar9->mName).length;
          (paVar25->mName).length = uVar40;
          memcpy((paVar25->mName).data,(paVar9->mName).data,(ulong)uVar40);
          (paVar25->mName).data[uVar40] = '\0';
        }
        paVar25->mNumMeshes = 1;
        puVar27 = (uint *)operator_new__(4);
        paVar25->mMeshes = puVar27;
        *puVar27 = (uint)uVar41;
        uVar41 = uVar41 + 1;
        lVar33 = lVar33 + 8;
      } while (uVar41 < pScene->mNumMeshes);
      uVar32 = pScene->mNumLights;
      ppaVar28 = (aiNode **)((long)ppaVar28 + lVar33);
    }
    if (uVar32 != 0) {
      lVar33 = 0;
      uVar41 = 0;
      do {
        paVar26 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar26);
        ppaVar28[uVar41] = paVar26;
        paVar26->mParent = pScene->mRootNode;
        pcVar1 = (paVar26->mName).data;
        uVar40 = snprintf(pcVar1,0x400,"light_%u",uVar41 & 0xffffffff);
        (paVar26->mName).length = uVar40;
        paVar25 = (aiNode *)pScene->mLights[uVar41];
        if (paVar25 != paVar26) {
          (paVar25->mName).length = uVar40;
          memcpy((paVar25->mName).data,pcVar1,(ulong)uVar40);
          (paVar25->mName).data[uVar40] = '\0';
        }
        uVar41 = uVar41 + 1;
        lVar33 = lVar33 + 8;
      } while (uVar41 < pScene->mNumLights);
      ppaVar28 = (aiNode **)((long)ppaVar28 + lVar33);
    }
    if (pScene->mNumCameras != 0) {
      uVar41 = 0;
      do {
        paVar26 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar26);
        ppaVar28[uVar41] = paVar26;
        paVar26->mParent = pScene->mRootNode;
        pcVar1 = (paVar26->mName).data;
        uVar40 = snprintf(pcVar1,0x400,"cam_%u",uVar41 & 0xffffffff);
        (paVar26->mName).length = uVar40;
        paVar25 = (aiNode *)pScene->mCameras[uVar41];
        if (paVar25 != paVar26) {
          (paVar25->mName).length = uVar40;
          memcpy((paVar25->mName).data,pcVar1,(ulong)uVar40);
          (paVar25->mName).data[uVar40] = '\0';
        }
        uVar41 = uVar41 + 1;
      } while (uVar41 < pScene->mNumCameras);
    }
  }
  else {
    MakeIdentityTransform(this,pScene->mRootNode);
  }
LAB_002f96e7:
  if (this->configNormalize == true) {
    uVar41 = (ulong)pScene->mNumMeshes;
    if (uVar41 == 0) {
      fVar50 = 1e+10;
      fVar44 = -1e+10;
      uVar47 = DAT_006a3770;
      uVar51 = DAT_006a3780;
    }
    else {
      fVar44 = -1e+10;
      fVar50 = 1e+10;
      uVar39 = 0;
      auVar48 = _DAT_006a3770;
      auVar52 = _DAT_006a3780;
      do {
        uVar38 = (ulong)pScene->mMeshes[uVar39]->mNumVertices;
        if (uVar38 != 0) {
          paVar24 = pScene->mMeshes[uVar39]->mVertices;
          lVar33 = 0;
          do {
            fVar46 = *(float *)((long)&paVar24->z + lVar33);
            if (fVar46 <= fVar50) {
              fVar50 = fVar46;
            }
            uVar8 = *(ulong *)((long)&paVar24->x + lVar33);
            auVar14._8_8_ = 0;
            auVar14._0_8_ = uVar8;
            auVar52 = minps(auVar52,auVar14);
            auVar15._8_8_ = 0;
            auVar15._0_8_ = uVar8;
            auVar48 = maxps(auVar48,auVar15);
            if (fVar44 <= fVar46) {
              fVar44 = fVar46;
            }
            lVar33 = lVar33 + 0xc;
          } while (uVar38 * 0xc != lVar33);
        }
        uVar51 = auVar52._0_8_;
        uVar47 = auVar48._0_8_;
        uVar39 = uVar39 + 1;
      } while (uVar39 != uVar41);
    }
    if (pScene->mNumMeshes != 0) {
      fVar44 = fVar44 - fVar50;
      fVar45 = (float)uVar47 - (float)uVar51;
      fVar53 = (float)((ulong)uVar51 >> 0x20);
      fVar49 = (float)((ulong)uVar47 >> 0x20) - fVar53;
      fVar46 = fVar44;
      if (fVar44 <= fVar49) {
        fVar46 = fVar49;
      }
      if (fVar46 <= fVar45) {
        fVar46 = fVar45;
      }
      fVar46 = 1.0 / (fVar46 * 0.5);
      uVar39 = 0;
      do {
        paVar9 = pScene->mMeshes[uVar39];
        if (paVar9->mNumVertices != 0) {
          lVar33 = 8;
          uVar41 = 0;
          do {
            paVar24 = paVar9->mVertices;
            fVar3 = *(float *)((long)&paVar24->x + lVar33);
            uVar47 = *(undefined8 *)((long)paVar24 + lVar33 + -8);
            *(ulong *)((long)paVar24 + lVar33 + -8) =
                 CONCAT44(((float)((ulong)uVar47 >> 0x20) - (fVar49 * 0.5 + fVar53)) * fVar46,
                          ((float)uVar47 - (fVar45 * 0.5 + (float)uVar51)) * fVar46);
            *(float *)((long)&paVar24->x + lVar33) = (fVar3 - (fVar44 * 0.5 + fVar50)) * fVar46;
            uVar41 = uVar41 + 1;
            lVar33 = lVar33 + 0xc;
          } while (uVar41 < paVar9->mNumVertices);
          uVar41 = (ulong)pScene->mNumMeshes;
        }
        uVar39 = uVar39 + 1;
      } while (uVar39 < uVar41);
    }
  }
  bVar20 = DefaultLogger::isNullLogger();
  if (!bVar20) {
    pLVar21 = DefaultLogger::get();
    Logger::debug(pLVar21,"PretransformVerticesProcess finished");
    pLVar21 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[9]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)aiTemp,
               (char (*) [9])0x6ba54a);
    std::ostream::_M_insert<unsigned_long>((ulong)aiTemp);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aiTemp," nodes and ",0xb);
    std::ostream::_M_insert<unsigned_long>((ulong)aiTemp);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aiTemp," animation channels (",0x15);
    CountNodes(this,pScene->mRootNode);
    std::ostream::_M_insert<unsigned_long>((ulong)aiTemp);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aiTemp," output nodes)",0xe);
    std::__cxx11::stringbuf::str();
    Logger::info(pLVar21,(char *)aiVFormats.
                                 super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl._M_node.super__List_node_base._M_next);
    psVar2 = &aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              _M_node._M_size;
    if (aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
        super__List_node_base._M_next != (_List_node_base *)psVar2) {
      operator_delete(aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl._M_node.super__List_node_base._M_next,
                      aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl._M_node._M_size + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)aiTemp);
    std::ios_base::~ios_base(local_138);
    pLVar21 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[6]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)aiTemp,
               (char (*) [6])"Kept ");
    std::ostream::_M_insert<unsigned_long>((ulong)aiTemp);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aiTemp," lights and ",0xc);
    std::ostream::_M_insert<unsigned_long>((ulong)aiTemp);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aiTemp," cameras.",9);
    std::__cxx11::stringbuf::str();
    Logger::info(pLVar21,(char *)aiVFormats.
                                 super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl._M_node.super__List_node_base._M_next);
    if (aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
        super__List_node_base._M_next != (_List_node_base *)psVar2) {
      operator_delete(aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl._M_node.super__List_node_base._M_next,
                      aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl._M_node._M_size + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)aiTemp);
    std::ios_base::~ios_base(local_138);
    pLVar21 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[7]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)aiTemp,
               (char (*) [7])"Moved ");
    std::ostream::_M_insert<unsigned_long>((ulong)aiTemp);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aiTemp," meshes to WCS (number of output meshes: ",0x29);
    std::ostream::_M_insert<unsigned_long>((ulong)aiTemp);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aiTemp,")",1);
    std::__cxx11::stringbuf::str();
    Logger::info(pLVar21,(char *)aiVFormats.
                                 super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl._M_node.super__List_node_base._M_next);
    if (aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
        super__List_node_base._M_next != (_List_node_base *)psVar2) {
      operator_delete(aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl._M_node.super__List_node_base._M_next,
                      aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl._M_node._M_size + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)aiTemp);
    std::ios_base::~ios_base(local_138);
  }
  if (apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PretransformVertices::Execute(aiScene *pScene) {
	ASSIMP_LOG_DEBUG("PretransformVerticesProcess begin");

	// Return immediately if we have no meshes
	if (!pScene->mNumMeshes)
		return;

	const unsigned int iOldMeshes = pScene->mNumMeshes;
	const unsigned int iOldAnimationChannels = pScene->mNumAnimations;
	const unsigned int iOldNodes = CountNodes(pScene->mRootNode);

	if (configTransform) {
		pScene->mRootNode->mTransformation = configTransformation;
	}

	// first compute absolute transformation matrices for all nodes
	ComputeAbsoluteTransform(pScene->mRootNode);

	// Delete aiMesh::mBones for all meshes. The bones are
	// removed during this step and we need the pointer as
	// temporary storage
	for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
		aiMesh *mesh = pScene->mMeshes[i];

		for (unsigned int a = 0; a < mesh->mNumBones; ++a)
			delete mesh->mBones[a];

		delete[] mesh->mBones;
		mesh->mBones = NULL;
	}

	// now build a list of output meshes
	std::vector<aiMesh *> apcOutMeshes;

	// Keep scene hierarchy? It's an easy job in this case ...
	// we go on and transform all meshes, if one is referenced by nodes
	// with different absolute transformations a depth copy of the mesh
	// is required.
	if (configKeepHierarchy) {

		// Hack: store the matrix we're transforming a mesh with in aiMesh::mBones
		BuildWCSMeshes(apcOutMeshes, pScene->mMeshes, pScene->mNumMeshes, pScene->mRootNode);

		// ... if new meshes have been generated, append them to the end of the scene
		if (apcOutMeshes.size() > 0) {
			aiMesh **npp = new aiMesh *[pScene->mNumMeshes + apcOutMeshes.size()];

			memcpy(npp, pScene->mMeshes, sizeof(aiMesh *) * pScene->mNumMeshes);
			memcpy(npp + pScene->mNumMeshes, &apcOutMeshes[0], sizeof(aiMesh *) * apcOutMeshes.size());

			pScene->mNumMeshes += static_cast<unsigned int>(apcOutMeshes.size());
			delete[] pScene->mMeshes;
			pScene->mMeshes = npp;
		}

		// now iterate through all meshes and transform them to worldspace
		for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
			ApplyTransform(pScene->mMeshes[i], *reinterpret_cast<aiMatrix4x4 *>(pScene->mMeshes[i]->mBones));

			// prevent improper destruction
			pScene->mMeshes[i]->mBones = NULL;
			pScene->mMeshes[i]->mNumBones = 0;
		}
	} else {
		apcOutMeshes.reserve(pScene->mNumMaterials << 1u);
		std::list<unsigned int> aiVFormats;

		std::vector<unsigned int> s(pScene->mNumMeshes, 0);
		BuildMeshRefCountArray(pScene->mRootNode, &s[0]);

		for (unsigned int i = 0; i < pScene->mNumMaterials; ++i) {
			// get the list of all vertex formats for this material
			aiVFormats.clear();
			GetVFormatList(pScene, i, aiVFormats);
			aiVFormats.sort();
			aiVFormats.unique();
			for (std::list<unsigned int>::const_iterator j = aiVFormats.begin(); j != aiVFormats.end(); ++j) {
				unsigned int iVertices = 0;
				unsigned int iFaces = 0;
				CountVerticesAndFaces(pScene, pScene->mRootNode, i, *j, &iFaces, &iVertices);
				if (0 != iFaces && 0 != iVertices) {
					apcOutMeshes.push_back(new aiMesh());
					aiMesh *pcMesh = apcOutMeshes.back();
					pcMesh->mNumFaces = iFaces;
					pcMesh->mNumVertices = iVertices;
					pcMesh->mFaces = new aiFace[iFaces];
					pcMesh->mVertices = new aiVector3D[iVertices];
					pcMesh->mMaterialIndex = i;
					if ((*j) & 0x2) pcMesh->mNormals = new aiVector3D[iVertices];
					if ((*j) & 0x4) {
						pcMesh->mTangents = new aiVector3D[iVertices];
						pcMesh->mBitangents = new aiVector3D[iVertices];
					}
					iFaces = 0;
					while ((*j) & (0x100 << iFaces)) {
						pcMesh->mTextureCoords[iFaces] = new aiVector3D[iVertices];
						if ((*j) & (0x10000 << iFaces))
							pcMesh->mNumUVComponents[iFaces] = 3;
						else
							pcMesh->mNumUVComponents[iFaces] = 2;
						iFaces++;
					}
					iFaces = 0;
					while ((*j) & (0x1000000 << iFaces))
						pcMesh->mColors[iFaces++] = new aiColor4D[iVertices];

					// fill the mesh ...
					unsigned int aiTemp[2] = { 0, 0 };
					CollectData(pScene, pScene->mRootNode, i, *j, pcMesh, aiTemp, &s[0]);
				}
			}
		}

		// If no meshes are referenced in the node graph it is possible that we get no output meshes.
		if (apcOutMeshes.empty()) {

			throw DeadlyImportError("No output meshes: all meshes are orphaned and are not referenced by any nodes");
		} else {
			// now delete all meshes in the scene and build a new mesh list
			for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
				aiMesh *mesh = pScene->mMeshes[i];
				mesh->mNumBones = 0;
				mesh->mBones = NULL;

				// we're reusing the face index arrays. avoid destruction
				for (unsigned int a = 0; a < mesh->mNumFaces; ++a) {
					mesh->mFaces[a].mNumIndices = 0;
					mesh->mFaces[a].mIndices = NULL;
				}

				delete mesh;

				// Invalidate the contents of the old mesh array. We will most
				// likely have less output meshes now, so the last entries of
				// the mesh array are not overridden. We set them to NULL to
				// make sure the developer gets notified when his application
				// attempts to access these fields ...
				mesh = NULL;
			}

			// It is impossible that we have more output meshes than
			// input meshes, so we can easily reuse the old mesh array
			pScene->mNumMeshes = (unsigned int)apcOutMeshes.size();
			for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
				pScene->mMeshes[i] = apcOutMeshes[i];
			}
		}
	}

	// remove all animations from the scene
	for (unsigned int i = 0; i < pScene->mNumAnimations; ++i)
		delete pScene->mAnimations[i];
	delete[] pScene->mAnimations;

	pScene->mAnimations = NULL;
	pScene->mNumAnimations = 0;

	// --- we need to keep all cameras and lights
	for (unsigned int i = 0; i < pScene->mNumCameras; ++i) {
		aiCamera *cam = pScene->mCameras[i];
		const aiNode *nd = pScene->mRootNode->FindNode(cam->mName);
		ai_assert(NULL != nd);

		// multiply all properties of the camera with the absolute
		// transformation of the corresponding node
		cam->mPosition = nd->mTransformation * cam->mPosition;
		cam->mLookAt = aiMatrix3x3(nd->mTransformation) * cam->mLookAt;
		cam->mUp = aiMatrix3x3(nd->mTransformation) * cam->mUp;
	}

	for (unsigned int i = 0; i < pScene->mNumLights; ++i) {
		aiLight *l = pScene->mLights[i];
		const aiNode *nd = pScene->mRootNode->FindNode(l->mName);
		ai_assert(NULL != nd);

		// multiply all properties of the camera with the absolute
		// transformation of the corresponding node
		l->mPosition = nd->mTransformation * l->mPosition;
		l->mDirection = aiMatrix3x3(nd->mTransformation) * l->mDirection;
		l->mUp = aiMatrix3x3(nd->mTransformation) * l->mUp;
	}

	if (!configKeepHierarchy) {

		// now delete all nodes in the scene and build a new
		// flat node graph with a root node and some level 1 children
		aiNode *newRoot = new aiNode();
		newRoot->mName = pScene->mRootNode->mName;
		delete pScene->mRootNode;
		pScene->mRootNode = newRoot;

		if (1 == pScene->mNumMeshes && !pScene->mNumLights && !pScene->mNumCameras) {
			pScene->mRootNode->mNumMeshes = 1;
			pScene->mRootNode->mMeshes = new unsigned int[1];
			pScene->mRootNode->mMeshes[0] = 0;
		} else {
			pScene->mRootNode->mNumChildren = pScene->mNumMeshes + pScene->mNumLights + pScene->mNumCameras;
			aiNode **nodes = pScene->mRootNode->mChildren = new aiNode *[pScene->mRootNode->mNumChildren];

			// generate mesh nodes
			for (unsigned int i = 0; i < pScene->mNumMeshes; ++i, ++nodes) {
				aiNode *pcNode = new aiNode();
				*nodes = pcNode;
				pcNode->mParent = pScene->mRootNode;
				pcNode->mName = pScene->mMeshes[i]->mName;

				// setup mesh indices
				pcNode->mNumMeshes = 1;
				pcNode->mMeshes = new unsigned int[1];
				pcNode->mMeshes[0] = i;
			}
			// generate light nodes
			for (unsigned int i = 0; i < pScene->mNumLights; ++i, ++nodes) {
				aiNode *pcNode = new aiNode();
				*nodes = pcNode;
				pcNode->mParent = pScene->mRootNode;
				pcNode->mName.length = ai_snprintf(pcNode->mName.data, MAXLEN, "light_%u", i);
				pScene->mLights[i]->mName = pcNode->mName;
			}
			// generate camera nodes
			for (unsigned int i = 0; i < pScene->mNumCameras; ++i, ++nodes) {
				aiNode *pcNode = new aiNode();
				*nodes = pcNode;
				pcNode->mParent = pScene->mRootNode;
				pcNode->mName.length = ::ai_snprintf(pcNode->mName.data, MAXLEN, "cam_%u", i);
				pScene->mCameras[i]->mName = pcNode->mName;
			}
		}
	} else {
		// ... and finally set the transformation matrix of all nodes to identity
		MakeIdentityTransform(pScene->mRootNode);
	}

	if (configNormalize) {
		// compute the boundary of all meshes
		aiVector3D min, max;
		MinMaxChooser<aiVector3D>()(min, max);

		for (unsigned int a = 0; a < pScene->mNumMeshes; ++a) {
			aiMesh *m = pScene->mMeshes[a];
			for (unsigned int i = 0; i < m->mNumVertices; ++i) {
				min = std::min(m->mVertices[i], min);
				max = std::max(m->mVertices[i], max);
			}
		}

		// find the dominant axis
		aiVector3D d = max - min;
		const ai_real div = std::max(d.x, std::max(d.y, d.z)) * ai_real(0.5);

		d = min + d * (ai_real)0.5;
		for (unsigned int a = 0; a < pScene->mNumMeshes; ++a) {
			aiMesh *m = pScene->mMeshes[a];
			for (unsigned int i = 0; i < m->mNumVertices; ++i) {
				m->mVertices[i] = (m->mVertices[i] - d) / div;
			}
		}
	}

	// print statistics
	if (!DefaultLogger::isNullLogger()) {
		ASSIMP_LOG_DEBUG("PretransformVerticesProcess finished");

		ASSIMP_LOG_INFO_F("Removed ", iOldNodes, " nodes and ", iOldAnimationChannels, " animation channels (",
				CountNodes(pScene->mRootNode), " output nodes)");
		ASSIMP_LOG_INFO_F("Kept ", pScene->mNumLights, " lights and ", pScene->mNumCameras, " cameras.");
		ASSIMP_LOG_INFO_F("Moved ", iOldMeshes, " meshes to WCS (number of output meshes: ", pScene->mNumMeshes, ")");
	}
}